

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void drawnumber_getrect(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,
                       t_float basey,int *xp1,int *yp1,int *xp2,int *yp2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  char *buf_00;
  float fVar8;
  t_float tVar9;
  t_float tVar10;
  char buf [1024];
  char local_438 [1032];
  
  fVar8 = 0.0;
  if (*(char *)&z[0xb].g_pd == '\x01') {
    if (*(char *)((long)&z[0xb].g_pd + 1) == '\0') {
      fVar8 = *(float *)&z[0xb].g_next;
    }
    else {
      fVar8 = template_getfloat(template,(t_symbol *)z[0xb].g_next,data,0);
    }
  }
  if ((fVar8 != 0.0) || (NAN(fVar8))) {
    uVar7 = 0;
    tVar9 = fielddesc_getcoord((_fielddesc *)&z[3].g_next,template,data,0);
    tVar9 = glist_xtopixels(glist,tVar9 + basex);
    tVar10 = fielddesc_getcoord((_fielddesc *)(z + 6),template,data,0);
    tVar10 = glist_ytopixels(glist,tVar10 + basey);
    iVar1 = glist_fontwidth(glist);
    iVar2 = glist_fontheight(glist);
    buf_00 = local_438;
    drawnumber_getbuf((t_drawnumber *)z,data,template,buf_00);
    pcVar4 = strchr(buf_00,10);
    iVar6 = 1;
    if (pcVar4 != (char *)0x0) {
      buf_00 = local_438;
      uVar7 = 0;
      do {
        if ((long)(int)uVar7 < (long)pcVar4 - (long)buf_00) {
          uVar7 = (uint)((long)pcVar4 - (long)buf_00);
        }
        iVar6 = iVar6 + 1;
        buf_00 = pcVar4 + 1;
        pcVar4 = strchr(buf_00,10);
      } while (pcVar4 != (char *)0x0);
    }
    sVar5 = strlen(buf_00);
    uVar3 = (uint)sVar5;
    if (sVar5 <= uVar7) {
      uVar3 = uVar7;
    }
    *xp1 = (int)tVar9;
    *yp1 = (int)tVar10;
    *xp2 = uVar3 * iVar1 + (int)tVar9;
    *yp2 = iVar6 * iVar2 + (int)tVar10;
  }
  else {
    *yp1 = 0x7fffffff;
    *xp1 = 0x7fffffff;
    *yp2 = -0x7fffffff;
    *xp2 = -0x7fffffff;
  }
  return;
}

Assistant:

static void drawnumber_getrect(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int *xp1, int *yp1, int *xp2, int *yp2)
{
    t_drawnumber *x = (t_drawnumber *)z;
    t_atom at;
    int xloc, yloc, fontwidth, fontheight, bufsize, width, height;
    char buf[DRAWNUMBER_BUFSIZE], *startline, *newline;

    if (!fielddesc_getfloat(&x->x_vis, template, data, 0))
    {
        *xp1 = *yp1 = 0x7fffffff;
        *xp2 = *yp2 = -0x7fffffff;
        return;
    }
    xloc = glist_xtopixels(glist,
        basex + fielddesc_getcoord(&x->x_xloc, template, data, 0));
    yloc = glist_ytopixels(glist,
        basey + fielddesc_getcoord(&x->x_yloc, template, data, 0));
    fontwidth = glist_fontwidth(glist);
    fontheight = glist_fontheight(glist);
    drawnumber_getbuf(x, data, template, buf);
    width = 0;
    height = 1;
    for (startline = buf; (newline = strchr(startline, '\n'));
        startline = newline+1)
    {
        if (newline - startline > width)
            width = (int)(newline - startline);
        height++;
    }
    if (strlen(startline) > (unsigned)width)
        width = (int)strlen(startline);
    *xp1 = xloc;
    *yp1 = yloc;
    *xp2 = xloc + fontwidth * width;
    *yp2 = yloc + fontheight * height;
}